

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall StateScene::draw(StateScene *this)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pPVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  stringstream stateString;
  stringstream countString;
  stringstream sunNumberString;
  stringstream levelString;
  stringstream scoreString;
  stringstream sunsString;
  string local_ad0;
  StateScene *local_ab0;
  long local_aa8;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  stringstream local_960 [16];
  ostream local_950 [112];
  ios_base aiStack_8e0 [264];
  stringstream local_7d8 [16];
  ostream local_7c8 [112];
  ios_base aiStack_758 [264];
  stringstream local_650 [16];
  ostream local_640 [112];
  ios_base aiStack_5d0 [264];
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  drawRect(this->x,this->y,this->w,this->h,0x19);
  std::__cxx11::stringstream::stringstream(local_960);
  switch(this->state) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>(local_950,"NORMAL",6);
    iVar12 = this->x;
    iVar6 = this->y;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar6 + 1,&local_980,0,0xf);
    paVar2 = &local_980.field_2;
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>(local_950,"PLANT",5);
    iVar12 = this->x;
    iVar6 = this->y;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar6 + 1,&local_9c0,0x22,0xf);
    paVar2 = &local_9c0.field_2;
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>(local_950,"REMOVE",6);
    iVar12 = this->x;
    iVar6 = this->y;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar6 + 1,&local_9e0,9,0xf);
    paVar2 = &local_9e0.field_2;
    break;
  default:
    goto switchD_0010bfc0_caseD_3;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>(local_950,"PAUSE",5);
    iVar12 = this->x;
    iVar6 = this->y;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar6 + 1,&local_9a0,0xb2,0xf);
    paVar2 = &local_9a0.field_2;
    break;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>(local_950,"GAME OVER",9);
    iVar12 = this->x;
    iVar6 = this->y;
    std::__cxx11::stringbuf::str();
    drawText(iVar12 + 2,iVar6 + 1,&local_a00,0x37,0xf);
    paVar2 = &local_a00.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar2->_M_allocated_capacity)[-2] != paVar2) {
    operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1);
  }
switchD_0010bfc0_caseD_3:
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"SUN: ",5);
  std::ostream::operator<<(local_1a8,this->sunsNumber);
  iVar12 = this->x;
  iVar6 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar6 + 2,&local_a20,0xd0,0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"SCORE: ",7);
  std::ostream::operator<<(local_330,this->score);
  iVar12 = this->x;
  iVar6 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar6 + 3,&local_a40,0x19,0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,"LEVEL: ",7);
  std::ostream::operator<<(local_4b8,this->level);
  iVar12 = this->x;
  iVar6 = this->y;
  std::__cxx11::stringbuf::str();
  drawText(iVar12 + 2,iVar6 + 4,&local_a60,0,0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
  }
  drawLine(this->x + 1,this->y + 1,this->h + -2,false,0xb);
  drawLine(this->stateW + this->x,this->y + 1,this->h + -2,false,0xb);
  iVar12 = this->startIndex;
  pPVar3 = (this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = (int)((ulong)((long)(this->infos).
                              super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pPVar3) >> 3);
  iVar4 = iVar7 * -0x49249249;
  iVar6 = this->plantsNumber + iVar12;
  if (SBORROW4(iVar6,iVar4) == iVar6 + iVar7 * 0x49249249 < 0) {
    iVar6 = iVar4;
  }
  if (iVar12 < iVar6) {
    lVar8 = (long)iVar12;
    iVar6 = iVar12 * 7 + 2;
    lVar11 = 0;
    lVar9 = lVar8;
    local_ab0 = this;
    do {
      iVar7 = this->x;
      iVar4 = this->y;
      iVar5 = this->stateW;
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      _Var1._M_p = (&pPVar3[lVar8].name._M_dataplus)[lVar11]._M_p;
      local_aa8 = lVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ad0,_Var1._M_p,
                 _Var1._M_p + (&pPVar3[lVar8].name._M_string_length)[lVar11]);
      iVar10 = (int)lVar11;
      drawText(iVar12 * -7 + iVar5 + iVar7 + iVar6 + iVar10,iVar4 + 3,&local_ad0,0xf,
               (&(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].color)[lVar11 * 2]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::stringstream(local_650);
      this = local_ab0;
      std::ostream::operator<<
                (local_640,
                 (&(local_ab0->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar8].needSunNumber)[lVar11 * 2]);
      iVar12 = this->x;
      iVar7 = this->y;
      iVar4 = this->stateW;
      iVar5 = this->startIndex;
      std::__cxx11::stringbuf::str();
      drawText(iVar5 * -7 + iVar4 + iVar12 + iVar6 + iVar10,iVar7 + 4,&local_aa0,0xf,0xd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
        operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::stringstream(local_7d8);
      std::ostream::operator<<
                (local_7c8,
                 (&(this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8].count)[lVar11 * 2]);
      iVar12 = this->x;
      iVar7 = this->y;
      iVar4 = this->stateW;
      iVar5 = this->startIndex;
      std::__cxx11::stringbuf::str();
      drawText(iVar5 * -7 + iVar4 + iVar12 + iVar6 + iVar10,iVar7 + 5,&local_a80,0xf,0x1b);
      lVar9 = local_aa8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
        operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_7d8);
      std::ios_base::~ios_base(aiStack_758);
      std::__cxx11::stringstream::~stringstream(local_650);
      std::ios_base::~ios_base(aiStack_5d0);
      lVar9 = lVar9 + 1;
      pPVar3 = (this->infos).super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = (int)((ulong)((long)(this->infos).
                                  super__Vector_base<PlantInfo,_std::allocator<PlantInfo>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pPVar3) >> 3);
      iVar4 = iVar5 * -0x49249249;
      iVar12 = this->startIndex;
      iVar7 = this->plantsNumber + iVar12;
      if (SBORROW4(iVar7,iVar4) == iVar7 + iVar5 * 0x49249249 < 0) {
        iVar7 = iVar4;
      }
      lVar11 = lVar11 + 7;
    } while (lVar9 < iVar7);
  }
  drawRect(this->selectIndex * 7 + this->x + this->stateW + 1,this->y + 1,7,7,9);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_960);
  std::ios_base::~ios_base(aiStack_8e0);
  return;
}

Assistant:

void StateScene::draw(){
	drawRect(x, y, w, h, BLUE);
	std::stringstream stateString;
	switch(state){
		case STATE_NORMAL:
			stateString << "NORMAL";
			drawText(x+2, y+1, stateString.str(), BLACK, WHITE);
			break;
		case STATE_PAUSE:
			stateString << "PAUSE";
			drawText(x+2, y+1, stateString.str(), YELLOW, WHITE);
			break;
		case STATE_PLANT:
			stateString << "PLANT";
			drawText(x+2, y+1, stateString.str(), GREEN, WHITE);
			break;
		case STATE_REMOVE:
			stateString << "REMOVE";
			drawText(x+2, y+1, stateString.str(), RED, WHITE);
			break;
		case STATE_OVER:
			stateString << "GAME OVER";
			drawText(x+2, y+1, stateString.str(), PURPLE, WHITE);
			break;

	}
	std::stringstream sunsString;
	sunsString << "SUN: " << sunsNumber;
	drawText(x+2, y+2, sunsString.str(), ORANGE, WHITE);
	std::stringstream scoreString;
	scoreString << "SCORE: " << score;
	drawText(x+2, y+3, scoreString.str(), BLUE, WHITE);
	std::stringstream levelString;
	levelString << "LEVEL: " << level;
	drawText(x+2, y+4, levelString.str(), BLACK, WHITE);



	drawLine(x+1, y+1, h-2, 0, LIGHTYELLOW);	
	drawLine(x+1+stateW-1, y+1, h-2, 0, LIGHTYELLOW);	

	
	for(int i = startIndex; i < std::min((int)infos.size(), startIndex+plantsNumber); ++i){
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+3, infos[i].name, WHITE, infos[i].color);
		std::stringstream sunNumberString;
		sunNumberString << infos[i].needSunNumber;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+4, sunNumberString.str(), WHITE, ORANGE);
		std::stringstream countString;
		countString << infos[i].count;
		drawText(x+1+stateW+(i-startIndex)*BLOCKW+1, y+5, countString.str(), WHITE, LIGHTBLUE);
	}


	drawRect(x+1+stateW+selectIndex*BLOCKW, y+1, BLOCKW, BLOCKW, RED);
}